

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

uchar * jpgd::decompress_jpeg_image_from_stream
                  (jpeg_decoder_stream *pStream,int *width,int *height,int *actual_comps,
                  int req_comps)

{
  uchar uVar1;
  mem_block *pmVar2;
  int iVar3;
  uchar *__ptr;
  uchar *puVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uchar *puVar9;
  size_t __n;
  uint8 *pScan_line;
  uint scan_line_len;
  jpeg_decoder decoder;
  uchar *local_35a8;
  long local_35a0;
  ulong local_3598;
  uint local_358c;
  jpeg_decoder local_3588;
  
  if ((actual_comps == (int *)0x0) ||
     (*actual_comps = 0,
     (req_comps == 0 || height == (int *)0x0) ||
     (width == (int *)0x0 || pStream == (jpeg_decoder_stream *)0x0))) {
    return (uchar *)0x0;
  }
  if (4 < (uint)req_comps) {
    return (uchar *)0x0;
  }
  if ((0x1aU >> (req_comps & 0x1fU) & 1) == 0) {
    return (uchar *)0x0;
  }
  jpeg_decoder::jpeg_decoder(&local_3588,pStream);
  if (local_3588.m_error_code == JPGD_SUCCESS) {
    uVar5 = (ulong)(uint)local_3588.m_image_x_size;
    *width = local_3588.m_image_x_size;
    *height = local_3588.m_image_y_size;
    *actual_comps = local_3588.m_comps_in_frame;
    iVar3 = jpeg_decoder::begin_decoding(&local_3588);
    if (iVar3 == 0) {
      __ptr = (uchar *)malloc((long)(local_3588.m_image_x_size * req_comps *
                                    local_3588.m_image_y_size));
      if (__ptr != (uchar *)0x0) {
        local_3598 = (ulong)(uint)local_3588.m_image_y_size;
        if (0 < local_3588.m_image_y_size) {
          __n = (size_t)(local_3588.m_image_x_size * req_comps);
          local_35a0 = uVar5 * 3;
          uVar8 = 0;
          puVar9 = __ptr;
          do {
            iVar3 = jpeg_decoder::decode(&local_3588,&local_35a8,&local_358c);
            if (iVar3 == 0) {
              if (((req_comps == 1) && (local_3588.m_comps_in_frame == 1)) ||
                 ((req_comps == 4 && (local_3588.m_comps_in_frame == 3)))) {
                memcpy(__ptr + uVar8 * __n,local_35a8,__n);
              }
              else if (local_3588.m_comps_in_frame == 3) {
                if (req_comps == 1) {
                  if (0 < local_3588.m_image_x_size) {
                    uVar7 = 0;
                    do {
                      puVar9[uVar7] =
                           (uchar)((uint)local_35a8[uVar7 * 4 + 2] * 0x1d2f +
                                   (uint)local_35a8[uVar7 * 4 + 1] * 0x9646 +
                                   (uint)local_35a8[uVar7 * 4] * 0x4c8b + 0x8000 >> 0x10);
                      uVar7 = uVar7 + 1;
                    } while (uVar5 != uVar7);
                  }
                }
                else if (0 < local_3588.m_image_x_size) {
                  puVar4 = local_35a8 + 2;
                  lVar6 = 0;
                  do {
                    puVar9[lVar6] = puVar4[-2];
                    puVar9[lVar6 + 1] = puVar4[-1];
                    puVar9[lVar6 + 2] = *puVar4;
                    puVar4 = puVar4 + 4;
                    lVar6 = lVar6 + 3;
                  } while (local_35a0 != lVar6);
                }
              }
              else if (local_3588.m_comps_in_frame == 1) {
                if (req_comps == 3) {
                  if (0 < local_3588.m_image_x_size) {
                    lVar6 = 0;
                    puVar4 = local_35a8;
                    do {
                      uVar1 = *puVar4;
                      puVar9[lVar6] = uVar1;
                      puVar9[lVar6 + 1] = uVar1;
                      puVar9[lVar6 + 2] = uVar1;
                      puVar4 = puVar4 + 1;
                      lVar6 = lVar6 + 3;
                    } while (local_35a0 != lVar6);
                  }
                }
                else if (0 < local_3588.m_image_x_size) {
                  uVar7 = 0;
                  do {
                    uVar1 = local_35a8[uVar7];
                    puVar9[uVar7 * 4] = uVar1;
                    puVar9[uVar7 * 4 + 1] = uVar1;
                    puVar9[uVar7 * 4 + 2] = uVar1;
                    puVar9[uVar7 * 4 + 3] = 0xff;
                    uVar7 = uVar7 + 1;
                  } while (uVar5 != uVar7);
                }
              }
            }
            else {
              free(__ptr);
            }
            if (iVar3 != 0) goto LAB_0010bee1;
            uVar8 = uVar8 + 1;
            puVar9 = puVar9 + __n;
          } while (uVar8 != local_3598);
        }
        goto LAB_0010bee3;
      }
    }
  }
LAB_0010bee1:
  __ptr = (uchar *)0x0;
LAB_0010bee3:
  local_3588.m_pStream = (jpeg_decoder_stream *)0x0;
  while (local_3588.m_pMem_blocks != (mem_block *)0x0) {
    pmVar2 = (local_3588.m_pMem_blocks)->m_pNext;
    free(local_3588.m_pMem_blocks);
    local_3588.m_pMem_blocks = pmVar2;
  }
  return __ptr;
}

Assistant:

unsigned char *decompress_jpeg_image_from_stream(jpeg_decoder_stream *pStream, int *width, int *height, int *actual_comps, int req_comps)
{
  if (!actual_comps)
    return NULL;
  *actual_comps = 0;

  if ((!pStream) || (!width) || (!height) || (!req_comps))
    return NULL;

  if ((req_comps != 1) && (req_comps != 3) && (req_comps != 4))
    return NULL;

  jpeg_decoder decoder(pStream);
  if (decoder.get_error_code() != JPGD_SUCCESS)
    return NULL;

  const int image_width = decoder.get_width(), image_height = decoder.get_height();
  *width = image_width;
  *height = image_height;
  *actual_comps = decoder.get_num_components();

  if (decoder.begin_decoding() != JPGD_SUCCESS)
    return NULL;

  const int dst_bpl = image_width * req_comps;

  uint8 *pImage_data = (uint8*)jpgd_malloc(dst_bpl * image_height);
  if (!pImage_data)
    return NULL;

  for (int y = 0; y < image_height; y++)
  {
    const uint8* pScan_line;
    uint scan_line_len;
    if (decoder.decode((const void**)&pScan_line, &scan_line_len) != JPGD_SUCCESS)
    {
      jpgd_free(pImage_data);
      return NULL;
    }

    uint8 *pDst = pImage_data + y * dst_bpl;

    if (((req_comps == 1) && (decoder.get_num_components() == 1)) || ((req_comps == 4) && (decoder.get_num_components() == 3)))
      memcpy(pDst, pScan_line, dst_bpl);
    else if (decoder.get_num_components() == 1)
    {
      if (req_comps == 3)
      {
        for (int x = 0; x < image_width; x++)
        {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst += 3;
        }
      }
      else
      {
        for (int x = 0; x < image_width; x++)
        {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst[3] = 255;
          pDst += 4;
        }
      }
    }
    else if (decoder.get_num_components() == 3)
    {
      if (req_comps == 1)
      {
        const int YR = 19595, YG = 38470, YB = 7471;
        for (int x = 0; x < image_width; x++)
        {
          int r = pScan_line[x*4+0];
          int g = pScan_line[x*4+1];
          int b = pScan_line[x*4+2];
          *pDst++ = static_cast<uint8>((r * YR + g * YG + b * YB + 32768) >> 16);
        }
      }
      else
      {
        for (int x = 0; x < image_width; x++)
        {
          pDst[0] = pScan_line[x*4+0];
          pDst[1] = pScan_line[x*4+1];
          pDst[2] = pScan_line[x*4+2];
          pDst += 3;
        }
      }
    }
  }

  return pImage_data;
}